

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

int tommy_tree_delta(tommy_tree_node *root)

{
  long in_FS_OFFSET;
  tommy_key_t local_28;
  tommy_key_t local_24;
  int right_height;
  int left_height;
  tommy_tree_node *root_local;
  
  if (root->prev == (tommy_node_struct *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = root->prev->key;
  }
  if (root->next == (tommy_node_struct *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = root->next->key;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_24 - local_28;
  }
  __stack_chk_fail();
}

Assistant:

static int tommy_tree_delta(tommy_tree_node* root)
{
	int left_height = root->prev ? root->prev->key : 0;
	int right_height = root->next ? root->next->key : 0;

	return left_height - right_height;
}